

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O2

void qt_painterpath_isect_curve(QBezier *bezier,QPointF *pt,int *winding,int depth)

{
  double dVar1;
  double dVar2;
  long in_FS_OFFSET;
  pair<QBezier,_QBezier> halves;
  QBezier local_d8;
  QBezier local_98;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  dVar1 = pt->xp;
  dVar2 = pt->yp;
  local_48 = 0xffffffff;
  uStack_44 = 0xffffffff;
  uStack_40 = 0xffffffff;
  uStack_3c = 0xffffffff;
  local_58 = 0xffffffff;
  uStack_54 = 0xffffffff;
  uStack_50 = 0xffffffff;
  uStack_4c = 0xffffffff;
  QBezier::bounds(bezier);
  if (((double)CONCAT44(uStack_4c,uStack_50) <= dVar2) &&
     (dVar2 < (double)CONCAT44(uStack_4c,uStack_50) + (double)CONCAT44(uStack_3c,uStack_40))) {
    if ((depth == 0x20) ||
       (((double)CONCAT44(uStack_3c,uStack_40) < 0.001 &&
        ((double)CONCAT44(uStack_44,local_48) <= 0.001 &&
         (double)CONCAT44(uStack_44,local_48) != 0.001)))) {
      if (bezier->x1 <= dVar1) {
        *winding = *winding + (uint)(bezier->y1 <= bezier->y4 && bezier->y4 != bezier->y1) * 2 + -1;
      }
    }
    else {
      local_98.x4._0_4_ = 0xffffffff;
      local_98.x4._4_4_ = 0xffffffff;
      local_98.y4._0_4_ = 0xffffffff;
      local_98.y4._4_4_ = 0xffffffff;
      local_98.x3._0_4_ = 0xffffffff;
      local_98.x3._4_4_ = 0xffffffff;
      local_98.y3._0_4_ = 0xffffffff;
      local_98.y3._4_4_ = 0xffffffff;
      local_98.x2._0_4_ = 0xffffffff;
      local_98.x2._4_4_ = 0xffffffff;
      local_98.y2._0_4_ = 0xffffffff;
      local_98.y2._4_4_ = 0xffffffff;
      local_98.x1._0_4_ = 0xffffffff;
      local_98.x1._4_4_ = 0xffffffff;
      local_98.y1._0_4_ = 0xffffffff;
      local_98.y1._4_4_ = 0xffffffff;
      local_d8.x4._0_4_ = 0xffffffff;
      local_d8.x4._4_4_ = 0xffffffff;
      local_d8.y4._0_4_ = 0xffffffff;
      local_d8.y4._4_4_ = 0xffffffff;
      local_d8.x3._0_4_ = 0xffffffff;
      local_d8.x3._4_4_ = 0xffffffff;
      local_d8.y3._0_4_ = 0xffffffff;
      local_d8.y3._4_4_ = 0xffffffff;
      local_d8.x2._0_4_ = 0xffffffff;
      local_d8.x2._4_4_ = 0xffffffff;
      local_d8.y2._0_4_ = 0xffffffff;
      local_d8.y2._4_4_ = 0xffffffff;
      local_d8.x1._0_4_ = 0xffffffff;
      local_d8.x1._4_4_ = 0xffffffff;
      local_d8.y1._0_4_ = 0xffffffff;
      local_d8.y1._4_4_ = 0xffffffff;
      QBezier::split(bezier);
      qt_painterpath_isect_curve(&local_d8,pt,winding,depth + 1);
      qt_painterpath_isect_curve(&local_98,pt,winding,depth + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_painterpath_isect_curve(const QBezier &bezier, const QPointF &pt,
                                       int *winding, int depth = 0)
{
    qreal y = pt.y();
    qreal x = pt.x();
    QRectF bounds = bezier.bounds();

    // potential intersection, divide and try again...
    // Please note that a sideeffect of the bottom exclusion is that
    // horizontal lines are dropped, but this is correct according to
    // scan conversion rules.
    if (y >= bounds.y() && y < bounds.y() + bounds.height()) {

        // hit lower limit... This is a rough threshold, but its a
        // tradeoff between speed and precision.
        const qreal lower_bound = qreal(.001);
        if (depth == 32 || (bounds.width() < lower_bound && bounds.height() < lower_bound)) {
            // We make the assumption here that the curve starts to
            // approximate a line after while (i.e. that it doesn't
            // change direction drastically during its slope)
            if (bezier.pt1().x() <= x) {
                (*winding) += (bezier.pt4().y() > bezier.pt1().y() ? 1 : -1);
            }
            return;
        }

        // split curve and try again...
        const auto halves = bezier.split();
        qt_painterpath_isect_curve(halves.first,  pt, winding, depth + 1);
        qt_painterpath_isect_curve(halves.second, pt, winding, depth + 1);
    }
}